

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void Armor_off_sub(boolean already_dead)

{
  boolean already_dead_local;
  
  if ((uarm->otyp == 0x5e) || (uarm->otyp == 0x69)) {
    u.uprops[1].extrinsic = u.uprops[1].extrinsic & 0xfffffffe;
    u.uprops[2].extrinsic = u.uprops[2].extrinsic & 0xfffffffe;
    u.uprops[3].extrinsic = u.uprops[3].extrinsic & 0xfffffffe;
    u.uprops[4].extrinsic = u.uprops[4].extrinsic & 0xfffffffe;
    u.uprops[5].extrinsic = u.uprops[5].extrinsic & 0xfffffffe;
    u.uprops[6].extrinsic = u.uprops[6].extrinsic & 0xfffffffe;
    u.uprops[7].extrinsic = u.uprops[7].extrinsic & 0xfffffffe;
    u.uprops[8].extrinsic = u.uprops[8].extrinsic & 0xfffffffe;
    u.uprops[0x2a].extrinsic = u.uprops[0x2a].extrinsic & 0xfffffffe;
  }
  if ((already_dead == '\0') && (uarmg == (obj *)0x0)) {
    selftouch("No longer petrify-resistant, you");
  }
  return;
}

Assistant:

static void Armor_off_sub(boolean already_dead)
{
    switch (uarm->otyp) {
	case CHROMATIC_DRAGON_SCALES:
	case CHROMATIC_DRAGON_SCALE_MAIL:
	    EFire_resistance	&= ~W_ARM;
	    ECold_resistance	&= ~W_ARM;
	    ESleep_resistance	&= ~W_ARM;
	    EDisint_resistance	&= ~W_ARM;
	    EShock_resistance	&= ~W_ARM;
	    EPoison_resistance	&= ~W_ARM;
	    EAcid_resistance	&= ~W_ARM;
	    EStone_resistance	&= ~W_ARM;
	    EReflecting		&= ~W_ARM;
	    break;
	default:
	    break;
    }

    if (!already_dead && !uarmg)
	selftouch("No longer petrify-resistant, you");
}